

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O2

ParquetColumnDefinition *
duckdb::ParquetColumnDefinition::Deserialize
          (ParquetColumnDefinition *__return_storage_ptr__,Deserializer *deserializer)

{
  LogicalType LStack_68;
  Value local_50;
  
  ParquetColumnDefinition(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<int>
            (deserializer,100,"field_id",&__return_storage_ptr__->field_id);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x65,"name",&__return_storage_ptr__->name);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0x67,"type",&__return_storage_ptr__->type);
  Deserializer::ReadProperty<duckdb::Value>
            (deserializer,0x68,"default_value",&__return_storage_ptr__->default_value);
  LogicalType::LogicalType(&LStack_68,SQLNULL);
  Value::Value(&local_50,&LStack_68);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::Value>
            (deserializer,0x69,"identifier",&__return_storage_ptr__->identifier,&local_50);
  Value::~Value(&local_50);
  LogicalType::~LogicalType(&LStack_68);
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnDefinition ParquetColumnDefinition::Deserialize(Deserializer &deserializer) {
	ParquetColumnDefinition result;
	deserializer.ReadPropertyWithDefault<int32_t>(100, "field_id", result.field_id);
	deserializer.ReadPropertyWithDefault<string>(101, "name", result.name);
	deserializer.ReadProperty<LogicalType>(103, "type", result.type);
	deserializer.ReadProperty<Value>(104, "default_value", result.default_value);
	deserializer.ReadPropertyWithExplicitDefault<Value>(105, "identifier", result.identifier, Value());
	return result;
}